

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.h
# Opt level: O2

void __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::ConstantMultiFieldModifier
          (ConstantMultiFieldModifier *this,NumberStringBuilder *prefix,NumberStringBuilder *suffix,
          bool overwrite,bool strong)

{
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__ConstantMultiFieldModifier_003a6ca8;
  NumberStringBuilder::NumberStringBuilder(&this->fPrefix,prefix);
  NumberStringBuilder::NumberStringBuilder(&this->fSuffix,suffix);
  this->fOverwrite = overwrite;
  this->fStrong = strong;
  (this->fParameters).obj = (ModifierStore *)0x0;
  return;
}

Assistant:

ConstantMultiFieldModifier(
            const NumberStringBuilder &prefix,
            const NumberStringBuilder &suffix,
            bool overwrite,
            bool strong)
      : fPrefix(prefix),
        fSuffix(suffix),
        fOverwrite(overwrite),
        fStrong(strong) {}